

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::arc
          (Fl_PostScript_Graphics_Driver *this,double x,double y,double r,double start,double a)

{
  double a_local;
  double start_local;
  double r_local;
  double y_local;
  double x_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  if (this->shape_ != 0) {
    this->gap_ = 0;
    if (start <= a) {
      clocale_printf(this,"%g %g %g %g %g arcn\n",x,y,r,-start,-a);
    }
    else {
      clocale_printf(this,"%g %g %g %g %g arc\n",x,y,r,-start,-a);
    }
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::arc(double x, double y, double r, double start, double a){
  if(shape_==NONE) return;
  gap_=0;
  if(start>a)
    clocale_printf("%g %g %g %g %g arc\n", x , y , r , -start, -a);
  else
    clocale_printf("%g %g %g %g %g arcn\n", x , y , r , -start, -a);
  
}